

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O0

void __thiscall xmrig::Watcher::Watcher(Watcher *this,String *path,IWatcherListener *listener)

{
  _func_int **pp_Var1;
  Watcher *this_00;
  _func_int **in_RDX;
  ITimerListener *in_RDI;
  String *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  
  ITimerListener::ITimerListener(in_RDI);
  in_RDI->_vptr_ITimerListener = (_func_int **)&PTR__Watcher_002b6838;
  in_RDI[1]._vptr_ITimerListener = in_RDX;
  String::String(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pp_Var1 = (_func_int **)operator_new(0x10);
  Timer::Timer((Timer *)in_stack_ffffffffffffffb0,(ITimerListener *)in_stack_ffffffffffffffa8);
  in_RDI[4]._vptr_ITimerListener = pp_Var1;
  pp_Var1 = (_func_int **)operator_new(0x88);
  in_RDI[5]._vptr_ITimerListener = pp_Var1;
  *in_RDI[5]._vptr_ITimerListener = (_func_int *)in_RDI;
  this_00 = (Watcher *)uv_default_loop();
  uv_fs_event_init(this_00,in_RDI[5]._vptr_ITimerListener);
  start(this_00);
  return;
}

Assistant:

xmrig::Watcher::Watcher(const String &path, IWatcherListener *listener) :
    m_listener(listener),
    m_path(path)
{
    m_timer = new Timer(this);

    m_fsEvent = new uv_fs_event_t;
    m_fsEvent->data = this;
    uv_fs_event_init(uv_default_loop(), m_fsEvent);

    start();
}